

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O1

MPP_RET vcodec_service_cmd_poll(void *ctx,MppDevPollCfg *cfg)

{
  uint uVar1;
  MPP_RET MVar2;
  MPP_RET *pMVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  
  uVar1 = ioctl(*(int *)((long)ctx + 0x10),0x40086c04);
  MVar2 = MPP_OK;
  if (uVar1 != 0) {
    pMVar3 = __errno_location();
    MVar2 = *pMVar3;
    pcVar4 = strerror(MVar2);
    _mpp_log_l(2,"vcodec_service","ioctl VPU_IOC_GET_REG failed ret %d errno %d %s\n",
               "vcodec_service_cmd_poll",(ulong)uVar1,(ulong)(uint)MVar2,pcVar4);
    MVar2 = *pMVar3;
  }
  iVar5 = *(int *)((long)ctx + 0x20) + 1;
  iVar6 = 0;
  if (iVar5 < *(int *)((long)ctx + 0x14)) {
    iVar6 = iVar5;
  }
  *(int *)((long)ctx + 0x20) = iVar6;
  return MVar2;
}

Assistant:

MPP_RET vcodec_service_cmd_poll(void *ctx, MppDevPollCfg *cfg)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;
    VcodecRegCfg *poll_cfg = &p->regs[p->reg_poll_idx];
    void *reg_get = poll_cfg->reg_get;
    RK_S32 reg_size = poll_cfg->reg_size;
    MPP_RET ret = vcodec_service_ioctl(p->fd, VPU_IOC_GET_REG,
                                       reg_get, reg_size);
    if (ret) {
        mpp_err_f("ioctl VPU_IOC_GET_REG failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
        ret = errno;
    }

    p->reg_poll_idx++;
    if (p->reg_poll_idx >= p->max_regs)
        p->reg_poll_idx = 0;

    (void)cfg;
    return ret;
}